

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

ReturnType __thiscall
pbrt::ParameterDictionary::lookupSingle<(pbrt::ParameterType)4>
          (ParameterDictionary *this,string *name,ReturnType defaultValue)

{
  bool bVar1;
  const_iterator ppPVar2;
  vector<double,_pstd::pmr::polymorphic_allocator<double>_> *this_00;
  size_t sVar3;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar4 [64];
  vector<double,_pstd::pmr::polymorphic_allocator<double>_> *values;
  ParsedParameter *p;
  const_iterator __end2;
  const_iterator __begin2;
  ParsedParameterVector *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_ffffffffffffffc0;
  ParsedParameter *param;
  const_iterator local_30;
  Tuple2<pbrt::Vector2,_float> TVar5;
  char *in_stack_fffffffffffffff8;
  undefined1 extraout_var [56];
  
  TVar5 = (Tuple2<pbrt::Vector2,_float>)vmovlpd_avx(in_ZMM0._0_16_);
  local_30 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
             ::begin(in_RDI);
  ppPVar2 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
            ::end(in_stack_ffffffffffffffc0);
  while( true ) {
    if (local_30 == ppPVar2) {
      return (ReturnType)TVar5;
    }
    param = *local_30;
    bVar1 = std::operator!=(&param->type,in_stack_ffffffffffffffb8);
    if ((!bVar1) &&
       (bVar1 = std::operator!=(&param->type,(char *)in_stack_ffffffffffffffb8), !bVar1)) break;
    local_30 = local_30 + 1;
  }
  this_00 = ParameterTypeTraits<(pbrt::ParameterType)4>::GetValues(param);
  bVar1 = pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::empty
                    ((vector<double,_pstd::pmr::polymorphic_allocator<double>_> *)0x437653);
  if (!bVar1) {
    sVar3 = pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::size(this_00);
    if (sVar3 < 3) {
      param->lookedUp = true;
      pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::data(this_00);
      auVar4._0_8_ = ParameterTypeTraits<(pbrt::ParameterType)4>::Convert
                               ((double *)this_00,(FileLoc *)0x4376c2);
      auVar4._8_56_ = extraout_var;
      TVar5 = (Tuple2<pbrt::Vector2,_float>)vmovlpd_avx(auVar4._0_16_);
      return (ReturnType)TVar5;
    }
    ErrorExit<std::__cxx11::string_const&>
              ((FileLoc *)values,in_stack_fffffffffffffff8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)TVar5);
  }
  ErrorExit<std::__cxx11::string_const&>
            ((FileLoc *)values,in_stack_fffffffffffffff8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)TVar5);
}

Assistant:

typename ParameterTypeTraits<PT>::ReturnType ParameterDictionary::lookupSingle(
    const std::string &name,
    typename ParameterTypeTraits<PT>::ReturnType defaultValue) const {
    // Search _params_ for parameter _name_
    using traits = ParameterTypeTraits<PT>;
    for (const ParsedParameter *p : params) {
        if (p->name != name || p->type != traits::typeName)
            continue;
        // Extract parameter values from _p_
        const auto &values = traits::GetValues(*p);

        // Issue error if incorrect number of parameter values were provided
        if (values.empty())
            ErrorExit(&p->loc, "No values provided for parameter \"%s\".", name);
        if (values.size() > traits::nPerItem)
            ErrorExit(&p->loc, "More than one value provided for parameter \"%s\".",
                      name);

        // Return parameter values as _ReturnType_
        p->lookedUp = true;
        return traits::Convert(values.data(), &p->loc);
    }

    return defaultValue;
}